

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int split_left_right(SXML_CHAR *str,SXML_CHAR sep,int *l0,int *l1,int *i_sep,int *r0,int *r1,
                    int ignore_spaces,int ignore_quotes)

{
  ushort **ppuVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  int local_5c;
  char local_4d;
  int local_4c;
  int iStack_48;
  SXML_CHAR quote;
  int is;
  int n1;
  int n0;
  int *r0_local;
  int *i_sep_local;
  int *l1_local;
  int *l0_local;
  SXML_CHAR sep_local;
  SXML_CHAR *str_local;
  
  local_4d = '\0';
  if (str == (SXML_CHAR *)0x0) {
    str_local._4_4_ = 0;
  }
  else {
    if (i_sep != (int *)0x0) {
      *i_sep = -1;
    }
    if (ignore_spaces == 0) {
      ignore_quotes = 0;
      is = 0;
      iStack_48 = 0;
      while( true ) {
        bVar4 = false;
        if (str[iStack_48] != '\0') {
          bVar4 = str[iStack_48] != sep;
        }
        if (!bVar4) break;
        iStack_48 = iStack_48 + 1;
      }
      local_4c = iStack_48;
    }
    else {
      is = 0;
      while( true ) {
        bVar4 = false;
        if (((str[is] != '\0') && (bVar4 = false, -1 < str[is])) && (bVar4 = false, str[is] < -0x80)
           ) {
          ppuVar1 = __ctype_b_loc();
          bVar4 = ((*ppuVar1)[(int)str[is]] & 0x2000) != 0;
        }
        if (!bVar4) break;
        is = is + 1;
      }
      if ((ignore_quotes == 0) || ((str[is] != '\"' && (str[is] != '\'')))) {
        iStack_48 = is;
        while( true ) {
          bVar4 = false;
          if ((str[iStack_48] != '\0') && (bVar4 = false, str[iStack_48] != sep)) {
            bVar4 = false;
            if ((-1 < str[iStack_48]) && (bVar4 = false, str[iStack_48] < -0x80)) {
              ppuVar1 = __ctype_b_loc();
              bVar4 = ((*ppuVar1)[(int)str[iStack_48]] & 0x2000) != 0;
            }
            bVar4 = (bool)(bVar4 ^ 1);
          }
          if (!bVar4) break;
          iStack_48 = iStack_48 + 1;
        }
        local_4c = iStack_48;
        while( true ) {
          bVar4 = false;
          if (((str[local_4c] != '\0') && (bVar4 = false, -1 < str[local_4c])) &&
             (bVar4 = false, str[local_4c] < -0x80)) {
            ppuVar1 = __ctype_b_loc();
            bVar4 = ((*ppuVar1)[(int)str[local_4c]] & 0x2000) != 0;
          }
          if (!bVar4) break;
          local_4c = local_4c + 1;
        }
      }
      else {
        iVar3 = is + 1;
        local_4d = str[is];
        iStack_48 = iVar3;
        while( true ) {
          bVar4 = false;
          if (str[iStack_48] != '\0') {
            bVar4 = str[iStack_48] != local_4d;
          }
          local_4c = iStack_48;
          if ((!bVar4) ||
             ((str[iStack_48] == '\\' &&
              (iStack_48 = iStack_48 + 1, local_4c = iStack_48, str[iStack_48] == '\0')))) break;
          iStack_48 = iStack_48 + 1;
        }
        do {
          local_4c = local_4c + 1;
          bVar4 = false;
          if ((str[local_4c] != '\0') &&
             ((bVar4 = false, -1 < str[local_4c] && (bVar4 = false, str[local_4c] < -0x80)))) {
            ppuVar1 = __ctype_b_loc();
            bVar4 = ((*ppuVar1)[(int)str[local_4c]] & 0x2000) != 0;
          }
          is = iVar3;
        } while (bVar4);
      }
    }
    if (l0 != (int *)0x0) {
      *l0 = is;
    }
    if (l1 != (int *)0x0) {
      *l1 = iStack_48 + -1;
    }
    if (i_sep != (int *)0x0) {
      *i_sep = local_4c;
    }
    if ((str[local_4c] == '\0') || (str[local_4c + 1] == '\0')) {
      if (r0 != (int *)0x0) {
        *r0 = local_4c;
      }
      if (r1 != (int *)0x0) {
        *r1 = local_4c + -1;
      }
      if (i_sep != (int *)0x0) {
        if (str[local_4c] == '\0') {
          local_5c = -1;
        }
        else {
          local_5c = local_4c;
        }
        *i_sep = local_5c;
      }
      str_local._4_4_ = 1;
    }
    else {
      is = local_4c + 1;
      if (ignore_spaces != 0) {
        while( true ) {
          bVar4 = false;
          if (((str[is] != '\0') && (bVar4 = false, -1 < str[is])) &&
             (bVar4 = false, str[is] < -0x80)) {
            ppuVar1 = __ctype_b_loc();
            bVar4 = ((*ppuVar1)[(int)str[is]] & 0x2000) != 0;
          }
          if (!bVar4) break;
          is = is + 1;
        }
        if ((ignore_quotes != 0) && ((str[is] == '\"' || (str[is] == '\'')))) {
          local_4d = str[is];
        }
      }
      iStack_48 = is + 1;
      while (((str[iStack_48] != '\0' && ((ignore_quotes == 0 || (str[iStack_48] != local_4d)))) &&
             ((str[iStack_48] != '\\' || (iStack_48 = iStack_48 + 1, str[iStack_48] != '\0'))))) {
        iStack_48 = iStack_48 + 1;
      }
      if ((ignore_quotes == 0) ||
         (lVar2 = (long)iStack_48, iStack_48 = iStack_48 + -1, str[lVar2] == local_4d)) {
        if (ignore_spaces == 0) {
          do {
            iStack_48 = iStack_48 + 1;
          } while (str[iStack_48] != '\0');
        }
        if (r0 != (int *)0x0) {
          *r0 = is + 1;
        }
        if (r1 != (int *)0x0) {
          *r1 = iStack_48;
        }
        str_local._4_4_ = 1;
      }
      else {
        str_local._4_4_ = 0;
      }
    }
  }
  return str_local._4_4_;
}

Assistant:

int split_left_right(SXML_CHAR* str, SXML_CHAR sep, int* l0, int* l1, int* i_sep, int* r0, int* r1, int ignore_spaces, int ignore_quotes)
{
	int n0, n1, is;
	SXML_CHAR quote = '\0';

	if (str == NULL)
		return FALSE;

	if (i_sep != NULL)
		*i_sep = -1;

	if (!ignore_spaces) /* No sense of ignore quotes if spaces are to be kept */
		ignore_quotes = FALSE;

	/* Parse left part */

	if (ignore_spaces) {
		for (n0 = 0; str[n0] != NULC && sx_isspace(str[n0]); n0++) ; /* Skip head spaces, n0 points to first non-space */
		if (ignore_quotes && isquote(str[n0])) { /* If quote is found, look for next one */
			quote = str[n0++]; /* Quote can be '\'' or '"' */
			for (n1 = n0; str[n1] != NULC && str[n1] != quote; n1++) {
				if (str[n1] == C2SX('\\') && str[++n1] == NULC)
					break; /* Escape character (can be the last) */
			}
			for (is = n1 + 1; str[is] != NULC && sx_isspace(str[is]); is++) ; /* '--' not to take quote into account */
		} else {
			for (n1 = n0; str[n1] != NULC && str[n1] != sep && !sx_isspace(str[n1]); n1++) ; /* Search for separator or a space */
			for (is = n1; str[is] != NULC && sx_isspace(str[is]); is++) ;
		}
	} else {
		n0 = 0;
		for (n1 = 0; str[n1] != NULC && str[n1] != sep; n1++) ; /* Search for separator only */
		is = n1;
	}

	/* Here 'n0' is the start of left member, 'n1' is the character after the end of left member */

	if (l0 != NULL)
		*l0 = n0;
	if (l1 != NULL)
		*l1 = n1 - 1;
	if (i_sep != NULL)
		*i_sep = is;
	if (str[is] == NULC || str[is+1] == NULC) { /* No separator => empty right member */
		if (r0 != NULL)
			*r0 = is;
		if (r1 != NULL)
			*r1 = is-1;
		if (i_sep != NULL)
			*i_sep = (str[is] == NULC ? -1 : is);
		return TRUE;
	}

	/* Parse right part */

	n0 = is + 1;
	if (ignore_spaces) {
		for (; str[n0] != NULC && sx_isspace(str[n0]); n0++) ;
		if (ignore_quotes && isquote(str[n0]))
			quote = str[n0];
	}

	for (n1 = ++n0; str[n1]; n1++) {
		if (ignore_quotes && str[n1] == quote) /* Quote was reached */
			break;
		if (str[n1] == C2SX('\\') && str[++n1] == NULC) /* Escape character (can be the last) */
			break;
	}
	if (ignore_quotes && str[n1--] != quote) /* Quote is not the same than earlier, '--' is not to take it into account */
		return FALSE;
	if (!ignore_spaces)
		while (str[++n1]) ; /* Jump down the end of the string */

	if (r0 != NULL)
		*r0 = n0;
	if (r1 != NULL)
		*r1 = n1;

	return TRUE;
}